

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_tar.c
# Opt level: O3

int64_t gnu_sparse_10_atol(archive_read *a,tar *tar,int64_t *remaining,size_t *unconsumed)

{
  char cVar1;
  archive_string *paVar2;
  long lVar3;
  char *pcVar4;
  void *pvVar5;
  archive_string *paVar6;
  int64_t iVar7;
  size_t sVar8;
  int error_number;
  size_t sVar9;
  size_t local_58;
  archive_read *local_50;
  archive_string *local_48;
  long *local_40;
  long local_38;
  
  local_48 = &tar->line;
  iVar7 = *remaining;
  local_50 = a;
  local_40 = remaining;
  do {
    if (99 < iVar7) {
      iVar7 = 100;
    }
    if (*unconsumed != 0) {
      __archive_read_consume(a,*unconsumed);
      *unconsumed = 0;
    }
    pcVar4 = (char *)__archive_read_ahead(a,1,(ssize_t *)&local_58);
    sVar8 = local_58;
    if ((long)local_58 < 1) {
      return -0x1e;
    }
    if (pcVar4 == (char *)0x0) {
      return -0x1e;
    }
    pvVar5 = memchr(pcVar4,10,local_58);
    if (pvVar5 == (void *)0x0) {
      *unconsumed = sVar8;
      if (iVar7 < (long)sVar8) goto LAB_00133fbb;
      pvVar5 = (void *)0x0;
      sVar9 = 0;
      local_38 = iVar7;
      while( true ) {
        paVar2 = local_48;
        paVar6 = archive_string_ensure(local_48,sVar8);
        if (paVar6 == (archive_string *)0x0) {
          pcVar4 = "Can\'t allocate working buffer";
          error_number = 0xc;
          goto LAB_00133fdf;
        }
        memcpy(paVar2->s + sVar9,pcVar4,local_58);
        a = local_50;
        if (*unconsumed != 0) {
          __archive_read_consume(local_50,*unconsumed);
          *unconsumed = 0;
        }
        lVar3 = local_38;
        sVar9 = sVar9 + local_58;
        if (pvVar5 != (void *)0x0) break;
        pcVar4 = (char *)__archive_read_ahead(a,1,(ssize_t *)&local_58);
        sVar8 = local_58;
        if ((long)local_58 < 1) {
          return -0x1e;
        }
        if (pcVar4 == (char *)0x0) {
          return -0x1e;
        }
        pvVar5 = memchr(pcVar4,10,local_58);
        if (pvVar5 != (void *)0x0) {
          sVar8 = (long)pvVar5 + (1 - (long)pcVar4);
          local_58 = sVar8;
        }
        *unconsumed = sVar8;
        sVar8 = sVar8 + sVar9;
        if (lVar3 < (long)sVar8) goto LAB_00133fbb;
      }
      pcVar4 = local_48->s;
    }
    else {
      sVar9 = (long)pvVar5 + (1 - (long)pcVar4);
      local_58 = sVar9;
      if (iVar7 < (long)sVar9) {
LAB_00133fbb:
        pcVar4 = "Line too long";
        error_number = 0x54;
LAB_00133fdf:
        archive_set_error(&local_50->archive,error_number,pcVar4);
        return -0x1e;
      }
      *unconsumed = sVar9;
      a = local_50;
    }
    if ((long)sVar9 < 1) {
      return -0x1e;
    }
    iVar7 = *local_40 - sVar9;
    *local_40 = iVar7;
    cVar1 = *pcVar4;
    if (cVar1 != '#') {
      if (cVar1 == '\n') {
        iVar7 = 0;
      }
      else {
        iVar7 = 0;
        do {
          pcVar4 = pcVar4 + 1;
          if ((byte)(cVar1 - 0x3aU) < 0xf6) {
            return -0x14;
          }
          lVar3 = 0x7fffffffffffffff;
          if (iVar7 < 0xccccccccccccccd) {
            lVar3 = 0x7fffffffffffffff;
            if (iVar7 != 0xccccccccccccccc || (byte)(cVar1 - 0x30U) < 8) {
              lVar3 = (ulong)(byte)(cVar1 - 0x30U) + iVar7 * 10;
            }
          }
          iVar7 = lVar3;
          if ((long)sVar9 < 2) {
            return -0x14;
          }
          sVar9 = sVar9 - 1;
          cVar1 = *pcVar4;
        } while (cVar1 != '\n');
      }
      return iVar7;
    }
  } while( true );
}

Assistant:

static int64_t
gnu_sparse_10_atol(struct archive_read *a, struct tar *tar,
    int64_t *remaining, size_t *unconsumed)
{
	int64_t l, limit, last_digit_limit;
	const char *p;
	ssize_t bytes_read;
	int base, digit;

	base = 10;
	limit = INT64_MAX / base;
	last_digit_limit = INT64_MAX % base;

	/*
	 * Skip any lines starting with '#'; GNU tar specs
	 * don't require this, but they should.
	 */
	do {
		bytes_read = readline(a, tar, &p,
			(ssize_t)tar_min(*remaining, 100), unconsumed);
		if (bytes_read <= 0)
			return (ARCHIVE_FATAL);
		*remaining -= bytes_read;
	} while (p[0] == '#');

	l = 0;
	while (bytes_read > 0) {
		if (*p == '\n')
			return (l);
		if (*p < '0' || *p >= '0' + base)
			return (ARCHIVE_WARN);
		digit = *p - '0';
		if (l > limit || (l == limit && digit > last_digit_limit))
			l = INT64_MAX; /* Truncate on overflow. */
		else
			l = (l * base) + digit;
		p++;
		bytes_read--;
	}
	/* TODO: Error message. */
	return (ARCHIVE_WARN);
}